

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix7.cpp
# Opt level: O0

void radix_sort7_int64(int64_t *array,size_t count)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong in_RSI;
  int64_t *in_RDI;
  size_t index;
  size_t value;
  size_t i_1;
  size_t i;
  int64_t *next;
  int64_t *queue_ptrs [256];
  int shift;
  size_t pass;
  int64_t *to;
  int64_t *from;
  freq_array_type freqs;
  unique_ptr<long[],_std::default_delete<long[]>_> queue_area;
  long *in_stack_ffffffffffffb778;
  undefined7 in_stack_ffffffffffffb780;
  undefined1 in_stack_ffffffffffffb787;
  size_t (*freqs_00) [256];
  long *in_stack_ffffffffffffb790;
  ulong local_4860;
  ulong local_4858;
  pointer local_4850;
  undefined8 auStack_4848 [256];
  undefined4 local_4044;
  ulong local_4040;
  pointer local_4038;
  int64_t *local_4030 [3];
  size_t local_4018 [2049];
  ulong local_10;
  int64_t *local_8;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_RSI;
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_10 = in_RSI;
  local_8 = in_RDI;
  operator_new__(uVar3);
  std::unique_ptr<long[],std::default_delete<long[]>>::
  unique_ptr<long*,std::default_delete<long[]>,void,bool>
            ((unique_ptr<long[],_std::default_delete<long[]>_> *)
             CONCAT17(in_stack_ffffffffffffb787,in_stack_ffffffffffffb780),in_stack_ffffffffffffb778
            );
  freqs_00 = (size_t (*) [256])local_4018;
  memset(freqs_00,0,0x4000);
  count_frequency(local_8,local_10,freqs_00);
  local_4030[0] = local_8;
  local_4038 = std::unique_ptr<long[],_std::default_delete<long[]>_>::get
                         ((unique_ptr<long[],_std::default_delete<long[]>_> *)
                          CONCAT17(in_stack_ffffffffffffb787,in_stack_ffffffffffffb780));
  for (local_4040 = 0; local_4040 < 8; local_4040 = local_4040 + 1) {
    in_stack_ffffffffffffb787 = is_trivial(local_4018 + local_4040 * 0x100,local_10);
    if (!(bool)in_stack_ffffffffffffb787) {
      local_4044 = (int)(local_4040 << 3);
      local_4850 = local_4038;
      for (local_4858 = 0; local_4858 < 0x100; local_4858 = local_4858 + 1) {
        auStack_4848[local_4858] = local_4850;
        local_4850 = local_4850 + local_4018[local_4040 * 0x100 + local_4858];
      }
      for (local_4860 = 0; local_4860 < local_10; local_4860 = local_4860 + 1) {
        uVar3 = local_4030[0][local_4860];
        in_stack_ffffffffffffb790 = (long *)(uVar3 >> ((byte)local_4044 & 0x3f) & 0xff);
        puVar1 = (ulong *)auStack_4848[(long)in_stack_ffffffffffffb790];
        auStack_4848[(long)in_stack_ffffffffffffb790] = puVar1 + 1;
        *puVar1 = uVar3;
      }
      std::swap<long*>(local_4030,&local_4038);
    }
  }
  if (local_4030[0] != local_8) {
    std::copy<long*,long*>
              (in_stack_ffffffffffffb790,(long *)freqs_00,
               (long *)CONCAT17(in_stack_ffffffffffffb787,in_stack_ffffffffffffb780));
  }
  std::unique_ptr<long[],_std::default_delete<long[]>_>::~unique_ptr
            ((unique_ptr<long[],_std::default_delete<long[]>_> *)
             CONCAT17(in_stack_ffffffffffffb787,in_stack_ffffffffffffb780));
  return;
}

Assistant:

void radix_sort7_int64(int64_t *array, size_t count) {
  std::unique_ptr<int64_t[]> queue_area(new int64_t[count]);
  // huge_unique_ptr<uint64_t[]> queue_area = make_huge_array<uint64_t>(count,
  // false);

  freq_array_type freqs = {};
  count_frequency(array, count, freqs);

  int64_t *from = array, *to = queue_area.get();

  for (size_t pass = 0; pass < RADIX_LEVELS; pass++) {

    if (is_trivial(freqs[pass], count)) {
      // this pass would do nothing, just skip it
      continue;
    }

    int shift = pass * RADIX_BITS;

    // array of pointers to the current position in each queue, which we set up
    // based on the known final sizes of each queue (i.e., "tighly packed")
    int64_t *queue_ptrs[RADIX_SIZE], *next = to;
    for (size_t i = 0; i < RADIX_SIZE; i++) {
      queue_ptrs[i] = next;
      next += freqs[pass][i];
    }

    // copy each element into the appropriate queue based on the current
    // RADIX_BITS sized "digit" within it
    for (size_t i = 0; i < count; i++) {
      size_t value = from[i];
      size_t index = (value >> shift) & RADIX_MASK;
      *queue_ptrs[index]++ = value;
      __builtin_prefetch(queue_ptrs[index] + 1);
    }

    // swap from and to areas
    std::swap(from, to);
  }

  // because of the last swap, the "from" area has the sorted payload: if it's
  // not the original array "a", do a final copy
  if (from != array) {
    std::copy(from, from + count, array);
  }
}